

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O1

void __thiscall CGameContext::SendTuningParams(CGameContext *this,int ClientID)

{
  uint i;
  long lVar1;
  long in_FS_OFFSET;
  CMsgPacker Msg;
  CPacker local_840;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CheckPureTuning(this);
  CPacker::Reset(&local_840);
  CPacker::AddInt(&local_840,0xc);
  lVar1 = 0;
  do {
    CPacker::AddInt(&local_840,(&(this->m_Tuning).m_GroundControlSpeed)[lVar1].m_Value);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x20);
  (*(this->m_pServer->super_IInterface)._vptr_IInterface[9])(this->m_pServer,&local_840,1,ClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendTuningParams(int ClientID)
{
	CheckPureTuning();

	CMsgPacker Msg(NETMSGTYPE_SV_TUNEPARAMS);
	int *pParams = (int *)&m_Tuning;
	for(unsigned i = 0; i < sizeof(m_Tuning)/sizeof(int); i++)
		Msg.AddInt(pParams[i]);
	Server()->SendMsg(&Msg, MSGFLAG_VITAL, ClientID);
}